

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O0

SERecurrentNode * __thiscall
spvtools::opt::SENodeSimplifyImpl::UpdateCoefficient
          (SENodeSimplifyImpl *this,SERecurrentNode *recurrent,int64_t coefficient_update)

{
  int iVar1;
  SERecurrentNode *this_00;
  ScalarEvolutionAnalysis *pSVar2;
  Loop *loop;
  SENode *pSVar3;
  SENode *operand_2;
  pointer pSVar4;
  undefined4 extraout_var;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_40;
  SENode *local_38;
  SENode *simplified;
  SENode *new_coefficient;
  unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
  new_recurrent_node;
  int64_t coefficient_update_local;
  SERecurrentNode *recurrent_local;
  SENodeSimplifyImpl *this_local;
  
  new_recurrent_node._M_t.
  super___uniq_ptr_impl<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::SERecurrentNode_*,_std::default_delete<spvtools::opt::SERecurrentNode>_>
  .super__Head_base<0UL,_spvtools::opt::SERecurrentNode_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>,_true,_true>
          )coefficient_update;
  this_00 = (SERecurrentNode *)::operator_new(0x48);
  pSVar2 = SENode::GetParentAnalysis(&recurrent->super_SENode);
  loop = SERecurrentNode::GetLoop(recurrent);
  SERecurrentNode::SERecurrentNode(this_00,pSVar2,loop);
  std::
  unique_ptr<spvtools::opt::SERecurrentNode,std::default_delete<spvtools::opt::SERecurrentNode>>::
  unique_ptr<std::default_delete<spvtools::opt::SERecurrentNode>,void>
            ((unique_ptr<spvtools::opt::SERecurrentNode,std::default_delete<spvtools::opt::SERecurrentNode>>
              *)&new_coefficient,this_00);
  pSVar2 = this->analysis_;
  pSVar3 = SERecurrentNode::GetCoefficient(recurrent);
  operand_2 = ScalarEvolutionAnalysis::CreateConstant
                        (this->analysis_,
                         (int64_t)new_recurrent_node._M_t.
                                  super___uniq_ptr_impl<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_spvtools::opt::SERecurrentNode_*,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                                  .super__Head_base<0UL,_spvtools::opt::SERecurrentNode_*,_false>.
                                  _M_head_impl);
  simplified = ScalarEvolutionAnalysis::CreateMultiplyNode(pSVar2,pSVar3,operand_2);
  local_38 = ScalarEvolutionAnalysis::SimplifyExpression(this->analysis_,simplified);
  iVar1 = (**local_38->_vptr_SENode)();
  if (iVar1 != 6) {
    simplified = local_38;
  }
  if ((long)new_recurrent_node._M_t.
            super___uniq_ptr_impl<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::SERecurrentNode_*,_std::default_delete<spvtools::opt::SERecurrentNode>_>
            .super__Head_base<0UL,_spvtools::opt::SERecurrentNode_*,_false>._M_head_impl < 0) {
    pSVar4 = std::
             unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
             ::operator->((unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                           *)&new_coefficient);
    pSVar2 = this->analysis_;
    pSVar3 = SERecurrentNode::GetOffset(recurrent);
    pSVar3 = ScalarEvolutionAnalysis::CreateNegation(pSVar2,pSVar3);
    SERecurrentNode::AddOffset(pSVar4,pSVar3);
  }
  else {
    pSVar4 = std::
             unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
             ::operator->((unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                           *)&new_coefficient);
    pSVar3 = SERecurrentNode::GetOffset(recurrent);
    SERecurrentNode::AddOffset(pSVar4,pSVar3);
  }
  pSVar4 = std::
           unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
           ::operator->((unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                         *)&new_coefficient);
  SERecurrentNode::AddCoefficient(pSVar4,simplified);
  pSVar2 = this->analysis_;
  std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>::
  unique_ptr<spvtools::opt::SERecurrentNode,std::default_delete<spvtools::opt::SERecurrentNode>,void>
            ((unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>> *)
             &local_40,
             (unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
              *)&new_coefficient);
  pSVar3 = ScalarEvolutionAnalysis::GetCachedOrAdd(pSVar2,&local_40);
  iVar1 = (*pSVar3->_vptr_SENode[6])();
  std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::~unique_ptr
            (&local_40);
  std::
  unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>::
  ~unique_ptr((unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
               *)&new_coefficient);
  return (SERecurrentNode *)CONCAT44(extraout_var,iVar1);
}

Assistant:

SERecurrentNode* SENodeSimplifyImpl::UpdateCoefficient(
    SERecurrentNode* recurrent, int64_t coefficient_update) const {
  std::unique_ptr<SERecurrentNode> new_recurrent_node{new SERecurrentNode(
      recurrent->GetParentAnalysis(), recurrent->GetLoop())};

  SENode* new_coefficient = analysis_.CreateMultiplyNode(
      recurrent->GetCoefficient(),
      analysis_.CreateConstant(coefficient_update));

  // See if the node can be simplified.
  SENode* simplified = analysis_.SimplifyExpression(new_coefficient);
  if (simplified->GetType() != SENode::CanNotCompute)
    new_coefficient = simplified;

  if (coefficient_update < 0) {
    new_recurrent_node->AddOffset(
        analysis_.CreateNegation(recurrent->GetOffset()));
  } else {
    new_recurrent_node->AddOffset(recurrent->GetOffset());
  }

  new_recurrent_node->AddCoefficient(new_coefficient);

  return analysis_.GetCachedOrAdd(std::move(new_recurrent_node))
      ->AsSERecurrentNode();
}